

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomString::read(DomString *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  int iVar2;
  undefined4 in_register_00000034;
  long lVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  undefined1 auVar12 [16];
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QString local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar3 = 0;
    do {
      local_68.m_data = *(storage_type_conflict **)(local_50.ptr + lVar3 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar3 + 0x10);
      if (local_68.m_size < 7) {
        if (local_68.m_size == 2) {
          QVar6.m_data = local_68.m_data;
          QVar6.m_size = 2;
          QVar10.m_data = L"id";
          QVar10.m_size = 2;
          cVar1 = QtPrivate::equalStrings(QVar6,QVar10);
          if (cVar1 == '\0') {
LAB_00169160:
            local_98.a.m_size = 0x15;
            local_98.a.m_data = "Unexpected attribute ";
            local_98.b = &local_68;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      (&local_80,&local_98);
            QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
          }
          else {
            QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar3 + 0x50),
                             *(longlong *)(local_50.ptr + lVar3 + 0x58));
            QString::operator=(&this->m_attr_id,&local_80);
            this->m_has_attr_id = true;
          }
        }
        else {
          if ((local_68.m_size != 4) ||
             (QVar4.m_data = local_68.m_data, QVar4.m_size = 4, QVar8.m_data = L"notr",
             QVar8.m_size = 4, cVar1 = QtPrivate::equalStrings(QVar4,QVar8), cVar1 == '\0'))
          goto LAB_00169160;
          QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar3 + 0x50),
                           *(longlong *)(local_50.ptr + lVar3 + 0x58));
          QString::operator=(&this->m_attr_notr,&local_80);
          this->m_has_attr_notr = true;
        }
      }
      else if (local_68.m_size == 7) {
        QVar7.m_data = local_68.m_data;
        QVar7.m_size = 7;
        QVar11.m_data = L"comment";
        QVar11.m_size = 7;
        cVar1 = QtPrivate::equalStrings(QVar7,QVar11);
        if (cVar1 == '\0') goto LAB_00169160;
        QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar3 + 0x50),
                         *(longlong *)(local_50.ptr + lVar3 + 0x58));
        QString::operator=(&this->m_attr_comment,&local_80);
        this->m_has_attr_comment = true;
      }
      else {
        if ((local_68.m_size != 0xc) ||
           (QVar5.m_data = local_68.m_data, QVar5.m_size = 0xc, QVar9.m_data = L"extracomment",
           QVar9.m_size = 0xc, cVar1 = QtPrivate::equalStrings(QVar5,QVar9), cVar1 == '\0'))
        goto LAB_00169160;
        QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar3 + 0x50),
                         *(longlong *)(local_50.ptr + lVar3 + 0x58));
        QString::operator=(&this->m_attr_extraComment,&local_80);
        this->m_has_attr_extraComment = true;
      }
      if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar3 = lVar3 + 0x68;
    } while (local_50.size * 0x68 - lVar3 != 0);
  }
  iVar2 = QXmlStreamReader::error();
  if (iVar2 == 0) {
    do {
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 == 4) {
        local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = (QStringView)QXmlStreamReader::name();
        local_98.a.m_size = 0x13;
        local_98.a.m_data = "Unexpected element ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>(&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
LAB_00169287:
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else if (iVar2 == 6) {
        cVar1 = QXmlStreamReader::isWhitespace();
        if (cVar1 == '\0') {
          auVar12 = QXmlStreamReader::text();
          QString::QString(&local_80,auVar12._8_8_,auVar12._0_8_);
          QString::append(&this->m_text);
          goto LAB_00169287;
        }
      }
      else if (iVar2 == 5) break;
      iVar2 = QXmlStreamReader::error();
    } while (iVar2 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomString::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"notr"_s) {
            setAttributeNotr(attribute.value().toString());
            continue;
        }
        if (name == u"comment"_s) {
            setAttributeComment(attribute.value().toString());
            continue;
        }
        if (name == u"extracomment"_s) {
            setAttributeExtraComment(attribute.value().toString());
            continue;
        }
        if (name == u"id"_s) {
            setAttributeId(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        case QXmlStreamReader::Characters :
            if (!reader.isWhitespace())
                m_text.append(reader.text().toString());
            break;
        default :
            break;
        }
    }
}